

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.cpp
# Opt level: O0

void __thiscall Refal2::CQualifierBuilder::AddChar(CQualifierBuilder *this,TChar c)

{
  bool bVar1;
  ulong __position;
  size_t tmpc;
  CQualifierBuilder *pCStack_10;
  TChar c_local;
  CQualifierBuilder *this_local;
  
  __position = (ulong)c;
  tmpc._7_1_ = c;
  pCStack_10 = this;
  if (__position < 0x80) {
    bVar1 = std::bitset<128UL>::test(&this->ansicharsFixed,__position);
    if (!bVar1) {
      std::bitset<128UL>::set(&this->ansichars,__position,(bool)((this->negative ^ 0xffU) & 1));
      std::bitset<128UL>::set(&this->ansicharsFixed,__position,true);
    }
  }
  else if ((this->negative & 1U) == 0) {
    CSetBuilder<char>::Include(&this->charsBuilder,(char *)((long)&tmpc + 7));
  }
  else {
    CSetBuilder<char>::Exclude(&this->charsBuilder,(char *)((long)&tmpc + 7));
  }
  return;
}

Assistant:

void CQualifierBuilder::AddChar( const TChar c )
{
	std::size_t tmpc = static_cast<std::size_t>( c );
	if( tmpc < AnsiSetSize ) {
		if( !ansicharsFixed.test( tmpc ) ) {
			ansichars.set( tmpc, !negative );
			ansicharsFixed.set( tmpc );
		}
	} else {
		if( negative ) {
			charsBuilder.Exclude( c );
		} else {
			charsBuilder.Include( c );
		}
	}
}